

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O2

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
volatileHash(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ValueLength VVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  
  VVar13 = byteSize(this);
  puVar19 = *(ulong **)this;
  if (VVar13 == 1) {
    uVar16 = SliceStaticData::PrecalculatedHashesForDefaultSeedWYHash[(byte)*puVar19];
  }
  else {
    uVar17 = 0xa0761d64a610dac0;
    if (VVar13 < 0x11) {
      if (VVar13 < 4) {
        if (VVar13 == 0) {
          uVar15 = 0;
        }
        else {
          uVar15 = (ulong)*(byte *)((long)puVar19 + (VVar13 - 1)) |
                   (ulong)((uint)*(byte *)((long)puVar19 + (VVar13 >> 1)) << 8 |
                          (uint)(byte)*puVar19 << 0x10);
        }
        uVar14 = 0;
      }
      else {
        uVar14 = (ulong)((uint)(VVar13 >> 1) & 0xc);
        uVar15 = CONCAT44((int)*puVar19,*(undefined4 *)((long)puVar19 + uVar14));
        uVar14 = CONCAT44(*(undefined4 *)((long)puVar19 + (VVar13 - 4)),
                          *(undefined4 *)((long)puVar19 + ((VVar13 - 4) - uVar14)));
      }
    }
    else {
      uVar14 = VVar13;
      if (0x30 < VVar13) {
        uVar15 = 0xa0761d64a610dac0;
        uVar18 = 0xa0761d64a610dac0;
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar17 ^ puVar19[1];
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *puVar19 ^ 0xe7037ed1a0b428db;
          uVar17 = SUB168(auVar3 * auVar9,8) ^ SUB168(auVar3 * auVar9,0);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar15 ^ puVar19[3];
          auVar10._8_8_ = 0;
          auVar10._0_8_ = puVar19[2] ^ 0x8ebc6af09c88c6e3;
          uVar15 = SUB168(auVar4 * auVar10,8) ^ SUB168(auVar4 * auVar10,0);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar18 ^ puVar19[5];
          auVar11._8_8_ = 0;
          auVar11._0_8_ = puVar19[4] ^ 0x589965cc75374cc3;
          uVar18 = SUB168(auVar5 * auVar11,8) ^ SUB168(auVar5 * auVar11,0);
          puVar19 = puVar19 + 6;
          uVar14 = uVar14 - 0x30;
        } while (0x30 < uVar14);
        uVar17 = uVar15 ^ uVar17 ^ uVar18;
      }
      for (; 0x10 < uVar14; uVar14 = uVar14 - 0x10) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar17 ^ puVar19[1];
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *puVar19 ^ 0xe7037ed1a0b428db;
        uVar17 = SUB168(auVar6 * auVar12,8) ^ SUB168(auVar6 * auVar12,0);
        puVar19 = puVar19 + 2;
      }
      uVar15 = *(ulong *)((long)puVar19 + (uVar14 - 0x10));
      uVar14 = *(ulong *)((long)puVar19 + (uVar14 - 8));
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar17 ^ uVar14;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar15 ^ 0xe7037ed1a0b428db;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = SUB168(auVar1 * auVar7,0) ^ SUB168(auVar1 * auVar7,8);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = VVar13 ^ 0xe7037ed1a0b428db;
    uVar16 = SUB168(auVar2 * auVar8,8) ^ SUB168(auVar2 * auVar8,0);
  }
  return uVar16;
}

Assistant:

inline uint64_t volatileHash() const {
    std::size_t const size = checkOverflow(byteSize());
    if (size == 1) {
      uint64_t h =
          SliceStaticData::PrecalculatedHashesForDefaultSeedWYHash[head()];
      VELOCYPACK_ASSERT(h != 0);
      return h;
    }
    return VELOCYPACK_HASH_WYHASH(start(), size, defaultSeed64);
  }